

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O3

void av1_setup_frame_buf_refs(AV1_COMMON *cm)

{
  RefCntBuffer *pRVar1;
  RefCntBuffer *pRVar2;
  long lVar3;
  
  pRVar1 = cm->cur_frame;
  pRVar1->order_hint = (cm->current_frame).order_hint;
  pRVar1->display_order_hint = (cm->current_frame).display_order_hint;
  pRVar1->pyramid_level = (cm->current_frame).pyramid_level;
  pRVar1->filter_level[0] = -1;
  pRVar1->filter_level[1] = -1;
  lVar3 = 0;
  do {
    if (((long)cm->remapped_ref_idx[lVar3] != -1) &&
       (pRVar2 = cm->ref_frame_map[cm->remapped_ref_idx[lVar3]], pRVar2 != (RefCntBuffer *)0x0)) {
      pRVar1->ref_order_hints[lVar3] = pRVar2->order_hint;
      pRVar1->ref_display_order_hint[lVar3] = pRVar2->display_order_hint;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 7);
  return;
}

Assistant:

void av1_setup_frame_buf_refs(AV1_COMMON *cm) {
  cm->cur_frame->order_hint = cm->current_frame.order_hint;
  cm->cur_frame->display_order_hint = cm->current_frame.display_order_hint;
  cm->cur_frame->pyramid_level = cm->current_frame.pyramid_level;
  cm->cur_frame->filter_level[0] = -1;
  cm->cur_frame->filter_level[1] = -1;
  MV_REFERENCE_FRAME ref_frame;
  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    if (buf != NULL) {
      cm->cur_frame->ref_order_hints[ref_frame - LAST_FRAME] = buf->order_hint;
      cm->cur_frame->ref_display_order_hint[ref_frame - LAST_FRAME] =
          buf->display_order_hint;
    }
  }
}